

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStreamComponent_RegisterChannels
                  (PaAlsaStreamComponent *self,PaUtilBufferProcessor *bp,unsigned_long *numFrames,
                  int *xrun)

{
  uint uVar1;
  snd_pcm_t *psVar2;
  undefined8 uVar3;
  bool bVar4;
  unsigned_long uVar5;
  snd_pcm_channel_area_t *psVar6;
  PaAlsaStreamComponent *pPVar7;
  int iVar8;
  uint uVar9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  int iVar15;
  long lVar16;
  code *pcVar17;
  undefined8 uStack_70;
  unsigned_long local_68;
  unsigned_long framesAvail;
  int *local_58;
  snd_pcm_channel_area_t *local_50;
  snd_pcm_channel_area_t *areas;
  PaError local_3c;
  PaAlsaStreamComponent *local_38;
  
  if (self->streamDir == StreamDirection_In) {
    pcVar17 = PaUtil_SetInputChannel;
  }
  else {
    pcVar17 = PaUtil_SetOutputChannel;
  }
  uStack_70 = 0x11400c;
  local_38 = self;
  paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames(self,&local_68,xrun);
  if (paUtilErr_ < 0) {
    uStack_70 = 0x1142bf;
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStreamComponent_GetAvailableFrames( self, &framesAvail, xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3969\n"
                     );
    return paUtilErr_;
  }
  if (*xrun != 0) {
    *numFrames = 0;
    return 0;
  }
  areas = (snd_pcm_channel_area_t *)pcVar17;
  if (local_38->canMmap != 0) {
    uStack_70 = 0x11405d;
    iVar8 = snd_pcm_mmap_begin(local_38->pcm,&local_50,&local_38->offset);
    local_3c = 0;
    if (iVar8 < 0) {
      uStack_70 = 0x1142d1;
      PaAlsaStreamComponent_RegisterChannels_cold_1();
      return -9999;
    }
    local_38->channelAreas = local_50;
    goto LAB_001140c2;
  }
  iVar8 = local_38->numHostChannels;
  uStack_70 = 0x114089;
  iVar15 = snd_pcm_format_size(local_38->nativeFormat,*numFrames);
  uVar9 = iVar15 * iVar8;
  if (local_38->nonMmapBufferSize < uVar9) {
    local_38->nonMmapBufferSize = uVar9;
    uStack_70 = 0x1140a5;
    pvVar10 = realloc(local_38->nonMmapBuffer,(ulong)uVar9);
    local_38->nonMmapBuffer = pvVar10;
    if (pvVar10 != (void *)0x0) goto LAB_001140b6;
    local_3c = -0x2708;
    bVar4 = false;
  }
  else {
LAB_001140b6:
    local_3c = 0;
    bVar4 = true;
  }
  if (!bVar4) {
    return local_3c;
  }
LAB_001140c2:
  psVar6 = areas;
  framesAvail = (unsigned_long)numFrames;
  local_58 = xrun;
  if (local_38->hostInterleaved == 0) {
    if (local_38->canMmap == 0) {
      if (0 < local_38->numUserChannels) {
        pvVar10 = local_38->nonMmapBuffer;
        uVar9 = local_38->nonMmapBufferSize;
        iVar8 = 0;
        uVar1 = local_38->numHostChannels;
        do {
          uStack_70 = 0x114211;
          (*(code *)psVar6)(bp,iVar8,pvVar10,1);
          pvVar10 = (void *)((long)pvVar10 + (ulong)uVar9 / (ulong)uVar1);
          iVar8 = iVar8 + 1;
        } while (iVar8 < local_38->numUserChannels);
      }
    }
    else if (0 < local_38->numUserChannels) {
      lVar16 = 0xc;
      uVar11 = 0;
      do {
        uStack_70 = 0x114155;
        (*(code *)psVar6)(bp,uVar11 & 0xffffffff,
                          ((ulong)*(uint *)((long)&local_50->addr + lVar16) * local_38->offset +
                           (ulong)*(uint *)((long)local_50 + lVar16 + -4) >> 3) +
                          *(long *)((long)local_50 + lVar16 + -0xc),1);
        uVar11 = uVar11 + 1;
        lVar16 = lVar16 + 0x10;
      } while ((long)uVar11 < (long)local_38->numUserChannels);
    }
  }
  else {
    uStack_70 = 0x1140e2;
    iVar8 = snd_pcm_format_size(local_38->nativeFormat,1);
    psVar6 = areas;
    if (local_38->canMmap == 0) {
      pvVar10 = local_38->nonMmapBuffer;
    }
    else {
      pvVar10 = (void *)(((ulong)local_50->step * local_38->offset + (ulong)local_50->first >> 3) +
                        (long)local_50->addr);
    }
    if (0 < local_38->numUserChannels) {
      iVar15 = 0;
      do {
        uStack_70 = 0x114190;
        (*(code *)psVar6)(bp,iVar15,pvVar10,local_38->numHostChannels);
        pvVar10 = (void *)((long)pvVar10 + (long)iVar8);
        iVar15 = iVar15 + 1;
      } while (iVar15 < local_38->numUserChannels);
    }
  }
  pPVar7 = local_38;
  piVar14 = local_58;
  uVar5 = framesAvail;
  if ((local_38->canMmap == 0) && (local_38->streamDir == StreamDirection_In)) {
    if (local_38->hostInterleaved == 0) {
      lVar16 = -((ulong)(uint)local_38->numHostChannels * 8 + 0xf & 0xfffffffffffffff0);
      lVar12 = (long)&local_68 + lVar16;
      uVar9 = local_38->numHostChannels;
      if (0 < (long)(int)uVar9) {
        pvVar10 = local_38->nonMmapBuffer;
        uVar1 = local_38->nonMmapBufferSize;
        lVar13 = 0;
        do {
          *(void **)(lVar12 + lVar13 * 8) = pvVar10;
          pvVar10 = (void *)((long)pvVar10 + (ulong)uVar1 / (ulong)uVar9);
          lVar13 = lVar13 + 1;
        } while ((int)uVar9 != lVar13);
      }
      psVar2 = pPVar7->pcm;
      uVar3 = *(undefined8 *)uVar5;
      *(undefined8 *)((long)&uStack_70 + lVar16) = 0x114289;
      iVar8 = snd_pcm_readn(psVar2,lVar12,uVar3);
    }
    else {
      uStack_70 = 0x1141d8;
      iVar8 = snd_pcm_readi(local_38->pcm,local_38->nonMmapBuffer,*(undefined8 *)framesAvail);
      piVar14 = local_58;
    }
    if ((iVar8 == -0x20) || (iVar8 == -0x56)) {
      *piVar14 = 1;
      *(undefined8 *)uVar5 = 0;
    }
  }
  return local_3c;
}

Assistant:

static PaError PaAlsaStreamComponent_RegisterChannels( PaAlsaStreamComponent* self, PaUtilBufferProcessor* bp,
        unsigned long* numFrames, int* xrun )
{
    PaError result = paNoError;
    const snd_pcm_channel_area_t *areas, *area;
    void (*setChannel)(PaUtilBufferProcessor *, unsigned int, void *, unsigned int) =
        StreamDirection_In == self->streamDir ? PaUtil_SetInputChannel : PaUtil_SetOutputChannel;
    unsigned char *buffer, *p;
    int i;
    unsigned long framesAvail;

    /* This _must_ be called before mmap_begin */
    PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( self, &framesAvail, xrun ) );
    if( *xrun )
    {
        *numFrames = 0;
        goto end;
    }

    if( self->canMmap )
    {
        ENSURE_( alsa_snd_pcm_mmap_begin( self->pcm, &areas, &self->offset, numFrames ), paUnanticipatedHostError );
        /* @concern ChannelAdaption Buffer address is recorded so we can do some channel adaption later */
        self->channelAreas = (snd_pcm_channel_area_t *)areas;
    }
    else
    {
        unsigned int bufferSize = self->numHostChannels * alsa_snd_pcm_format_size( self->nativeFormat, *numFrames );
        if( bufferSize > self->nonMmapBufferSize )
        {
            self->nonMmapBuffer = realloc( self->nonMmapBuffer, ( self->nonMmapBufferSize = bufferSize ) );
            if( !self->nonMmapBuffer )
            {
                result = paInsufficientMemory;
                goto error;
            }
        }
    }

    if( self->hostInterleaved )
    {
        int swidth = alsa_snd_pcm_format_size( self->nativeFormat, 1 );

        p = buffer = self->canMmap ? ExtractAddress( areas, self->offset ) : self->nonMmapBuffer;
        for( i = 0; i < self->numUserChannels; ++i )
        {
            /* We're setting the channels up to userChannels, but the stride will be hostChannels samples */
            setChannel( bp, i, p, self->numHostChannels );
            p += swidth;
        }
    }
    else
    {
        if( self->canMmap )
        {
            for( i = 0; i < self->numUserChannels; ++i )
            {
                area = areas + i;
                buffer = ExtractAddress( area, self->offset );
                setChannel( bp, i, buffer, 1 );
            }
        }
        else
        {
            unsigned int buf_per_ch_size = self->nonMmapBufferSize / self->numHostChannels;
            buffer = self->nonMmapBuffer;
            for( i = 0; i < self->numUserChannels; ++i )
            {
                setChannel( bp, i, buffer, 1 );
                buffer += buf_per_ch_size;
            }
        }
    }

    if( !self->canMmap && StreamDirection_In == self->streamDir )
    {
        /* Read sound */
        int res;
        if( self->hostInterleaved )
            res = alsa_snd_pcm_readi( self->pcm, self->nonMmapBuffer, *numFrames );
        else
        {
            void *bufs[self->numHostChannels];
            unsigned int buf_per_ch_size = self->nonMmapBufferSize / self->numHostChannels;
            unsigned char *buffer = self->nonMmapBuffer;
            int i;
            for( i = 0; i < self->numHostChannels; ++i )
            {
                bufs[i] = buffer;
                buffer += buf_per_ch_size;
            }
            res = alsa_snd_pcm_readn( self->pcm, bufs, *numFrames );
        }
        if( res == -EPIPE || res == -ESTRPIPE )
        {
            *xrun = 1;
            *numFrames = 0;
        }
    }

end:
error:
    return result;
}